

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::pawn_quiets(Movegen *this,U64 *single,U64 *dbl)

{
  code *local_40;
  int local_2c;
  int i;
  _func_void_U64_ptr *s;
  U64 *dbl_local;
  U64 *single_local;
  Movegen *this_local;
  
  if (this->pawns != 0) {
    *single = this->pawns & *(ulong *)(bitboards::pawnmask + (ulong)this->us * 8);
    *dbl = this->pawns & this->rank2;
    if (this->us == white) {
      local_40 = anon_unknown.dwarf_8003e::shift<(Dir)0>;
    }
    else {
      local_40 = anon_unknown.dwarf_8003e::shift<(Dir)1>;
    }
    (*local_40)(single);
    *single = this->qtarget & *single;
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      (*local_40)(dbl);
      *dbl = this->empty & *dbl;
    }
    if (this->evasion_target != 0) {
      *dbl = this->evasion_target & *dbl;
    }
  }
  return;
}

Assistant:

inline void Movegen::pawn_quiets(U64& single, U64& dbl) {

	if (pawns == 0ULL) return;

	single = pawns & bitboards::pawnmask[us]; // filter the promotion candidates  
	dbl = pawns & rank2;

	auto s = (us == white ? shift<N> : shift<S>);

	s(single);
	single &= qtarget;

	for (int i = 0; i < 2; ++i) {
		s(dbl);
		dbl &= empty;
	}
	if (evasion_target != 0ULL) dbl &= evasion_target;
}